

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

HTTPAPI_RESULT
HTTPAPI_ExecuteRequest
          (HTTP_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE httpHeadersHandle,uchar *content,size_t contentLength,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHeadersHandle,BUFFER_HANDLE responseContent)

{
  HTTP_HEADERS_RESULT HVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  curl_slist *pcVar7;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 uVar10;
  undefined4 uVar11;
  LOGGER_LOG local_230;
  ulong local_220;
  LOGGER_LOG l_41;
  LOGGER_LOG l_40;
  LOGGER_LOG l_39;
  LOGGER_LOG l_38;
  LOGGER_LOG l_37;
  long httpCode;
  LOGGER_LOG l_36;
  LOGGER_LOG l_35;
  LOGGER_LOG p_Stack_1b8;
  CURLcode curlRes;
  LOGGER_LOG l_34;
  LOGGER_LOG l_33;
  LOGGER_LOG l_32;
  LOGGER_LOG l_31;
  LOGGER_LOG l_30;
  LOGGER_LOG l_29;
  LOGGER_LOG l_28;
  curl_slist *newHeaders;
  LOGGER_LOG l_27;
  char *tempBuffer;
  size_t i;
  curl_slist *headers;
  LOGGER_LOG l_26;
  LOGGER_LOG l_25;
  LOGGER_LOG l_24;
  LOGGER_LOG l_23;
  LOGGER_LOG l_22;
  LOGGER_LOG l_21;
  LOGGER_LOG l_20;
  LOGGER_LOG l_19;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t tempHostURL_size;
  char *tempHostURL;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  HTTP_RESPONSE_CONTENT_BUFFER responseContentBuffer;
  size_t headersCount;
  HTTP_HANDLE_DATA *httpHandleData;
  HTTPAPI_RESULT result;
  size_t contentLength_local;
  uchar *content_local;
  HTTP_HEADERS_HANDLE httpHeadersHandle_local;
  char *relativePath_local;
  HTTPAPI_REQUEST_TYPE requestType_local;
  HTTP_HANDLE handle_local;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if ((((handle == (HTTP_HANDLE)0x0) || (relativePath == (char *)0x0)) ||
      (httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0)) ||
     ((content == (uchar *)0x0 && (contentLength != 0)))) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    l_1 = p_Var3;
    pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_INVALID_ARG);
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",0x204,1,"(result = %s%s (%d))","",pcVar4,CONCAT44(uVar10,2))
    ;
    return HTTPAPI_INVALID_ARG;
  }
  HVar1 = HTTPHeaders_GetHeaderCount(httpHeadersHandle,(size_t *)&responseContentBuffer.error);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if (HVar1 != HTTP_HEADERS_OK) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_INVALID_ARG;
    }
    tempHostURL = (char *)p_Var3;
    pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_INVALID_ARG);
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",0x209,1,"(result = %s%s (%d))","",pcVar4,CONCAT44(uVar10,2))
    ;
    return HTTPAPI_INVALID_ARG;
  }
  sVar5 = strlen(handle->hostURL);
  sVar6 = strlen(relativePath);
  if (sVar5 < -sVar6 - 1) {
    sVar5 = strlen(handle->hostURL);
    sVar6 = strlen(relativePath);
    local_220 = sVar5 + sVar6;
  }
  else {
    local_220 = 0xffffffffffffffff;
  }
  if (local_220 < 0xfffffffffffffffe) {
    local_230 = (LOGGER_LOG)(local_220 + 1);
  }
  else {
    local_230 = (LOGGER_LOG)0xffffffffffffffff;
  }
  l_2 = local_230;
  if (local_230 == (LOGGER_LOG)0xffffffffffffffff) {
    l_3 = xlogging_get_log_function();
    if (l_3 != (LOGGER_LOG)0x0) {
      (*l_3)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
             ,"HTTPAPI_ExecuteRequest",0x212,1,"Invalid malloc size");
    }
    tempHostURL_size = 0;
  }
  else {
    tempHostURL_size = (size_t)malloc((size_t)local_230);
  }
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if (tempHostURL_size == 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return HTTPAPI_ERROR;
    }
    l_4 = p_Var3;
    pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_ERROR);
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
              ,"HTTPAPI_ExecuteRequest",0x21d,1,"(result = %s%s (%d))","",pcVar4,CONCAT44(uVar10,3))
    ;
    return HTTPAPI_ERROR;
  }
  iVar2 = curl_easy_setopt(handle->curl,0x29,handle->verbose);
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  if (iVar2 == 0) {
    iVar2 = strcpy_s((char *)tempHostURL_size,(size_t)l_2,handle->hostURL);
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    if (iVar2 == 0) {
      iVar2 = strcat_s((char *)tempHostURL_size,(size_t)l_2,relativePath);
      uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      if (iVar2 == 0) {
        iVar2 = curl_easy_setopt(handle->curl,0x2712,tempHostURL_size);
        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
        if (iVar2 == 0) {
          iVar2 = curl_easy_setopt(handle->curl,0x9b,handle->timeout);
          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
          if (iVar2 == 0) {
            iVar2 = curl_easy_setopt(handle->curl,0x13,handle->lowSpeedLimit);
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
            if (iVar2 == 0) {
              iVar2 = curl_easy_setopt(handle->curl,0x14,handle->lowSpeedTime);
              uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
              if (iVar2 == 0) {
                iVar2 = curl_easy_setopt(handle->curl,0x4a,handle->freshConnect);
                uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                if (iVar2 == 0) {
                  iVar2 = curl_easy_setopt(handle->curl,0x4b,handle->forbidReuse);
                  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                  if (iVar2 == 0) {
                    iVar2 = curl_easy_setopt(handle->curl,0x54,2);
                    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                    if (iVar2 == 0) {
                      httpHandleData._4_4_ = HTTPAPI_OK;
                      switch(requestType) {
                      case HTTPAPI_REQUEST_GET:
                        iVar2 = curl_easy_setopt(handle->curl,0x50,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                          if (iVar2 != 0) {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            l_16 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x266,1,"(result = %s%s (%d))","",
                                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_15 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x25f,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      case HTTPAPI_REQUEST_POST:
                        iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                          if (iVar2 != 0) {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            l_21 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x28a,1,"(result = %s%s (%d))","",
                                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_20 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x283,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      case HTTPAPI_REQUEST_PUT:
                        iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2734,"PUT");
                          if (iVar2 != 0) {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            l_23 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x29b,1,"(result = %s%s (%d))","",
                                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_22 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x294,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      case HTTPAPI_REQUEST_DELETE:
                        iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2734,"DELETE");
                          if (iVar2 != 0) {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            l_25 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x2ab,1,"(result = %s%s (%d))","",
                                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_24 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x2a4,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      case HTTPAPI_REQUEST_PATCH:
                        iVar2 = curl_easy_setopt(handle->curl,0x2f,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2734,"PATCH");
                          if (iVar2 != 0) {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            pcVar7 = (curl_slist *)xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            headers = pcVar7;
                            if (pcVar7 != (curl_slist *)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*(code *)pcVar7)(0,
                                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                ,"HTTPAPI_ExecuteRequest",699,1,
                                                "(result = %s%s (%d))","",in_stack_fffffffffffffc90,
                                                in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_26 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x2b4,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      case HTTPAPI_REQUEST_HEAD:
                        iVar2 = curl_easy_setopt(handle->curl,0x50,1);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2c,1);
                          if (iVar2 == 0) {
                            iVar2 = curl_easy_setopt(handle->curl,0x2734,0);
                            if (iVar2 != 0) {
                              httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                              p_Var3 = xlogging_get_log_function();
                              uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                              l_19 = p_Var3;
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                in_stack_fffffffffffffc90 =
                                     HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                in_stack_fffffffffffffc88 = 0;
                                in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                          ,"HTTPAPI_ExecuteRequest",0x27a,1,"(result = %s%s (%d))",
                                          "",in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                              }
                            }
                          }
                          else {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                            l_18 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              in_stack_fffffffffffffc90 =
                                   HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              in_stack_fffffffffffffc88 = 0;
                              in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x275,1,"(result = %s%s (%d))","",
                                        in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                            }
                          }
                        }
                        else {
                          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                          p_Var3 = xlogging_get_log_function();
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          l_17 = p_Var3;
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            in_stack_fffffffffffffc90 =
                                 HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                            in_stack_fffffffffffffc88 = 0;
                            in_stack_fffffffffffffc98 = CONCAT44(uVar10,5);
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_ExecuteRequest",0x270,1,"(result = %s%s (%d))","",
                                      in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                          }
                        }
                        break;
                      default:
                        httpHandleData._4_4_ = HTTPAPI_INVALID_ARG;
                        p_Var3 = xlogging_get_log_function();
                        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                        l_14 = p_Var3;
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          in_stack_fffffffffffffc90 = HTTPAPI_RESULTStrings(HTTPAPI_INVALID_ARG);
                          in_stack_fffffffffffffc88 = 0;
                          in_stack_fffffffffffffc98 = CONCAT44(uVar10,2);
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                    ,"HTTPAPI_ExecuteRequest",600,1,"(result = %s%s (%d))","",
                                    in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
                        }
                      }
                      if (httpHandleData._4_4_ == HTTPAPI_OK) {
                        i = 0;
                        tempBuffer = (char *)0x0;
                        while( true ) {
                          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffc90 >> 0x20);
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc88 >> 0x20);
                          uVar11 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          if ((ulong)responseContentBuffer._16_8_ <= tempBuffer) break;
                          HVar1 = HTTPHeaders_GetHeader
                                            (httpHeadersHandle,(size_t)tempBuffer,(char **)&l_27);
                          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffc90 >> 0x20);
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc88 >> 0x20);
                          uVar11 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          if (HVar1 != HTTP_HEADERS_OK) {
                            httpHandleData._4_4_ = HTTPAPI_HTTP_HEADERS_FAILED;
                            pcVar7 = (curl_slist *)xlogging_get_log_function();
                            newHeaders = pcVar7;
                            if (pcVar7 != (curl_slist *)0x0) {
                              pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_HTTP_HEADERS_FAILED);
                              uVar10 = 0;
                              uVar8 = CONCAT44(uVar11,0xd);
                              (*(code *)pcVar7)(0,
                                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                ,"HTTPAPI_ExecuteRequest",0x2cf,1,
                                                "(result = %s%s (%d))","",pcVar4,uVar8);
                              uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                              uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                            }
                            break;
                          }
                          l_28 = (LOGGER_LOG)curl_slist_append(i,l_27);
                          uVar9 = (undefined4)((ulong)in_stack_fffffffffffffc90 >> 0x20);
                          uVar10 = (undefined4)((ulong)in_stack_fffffffffffffc88 >> 0x20);
                          uVar11 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
                          if (l_28 == (LOGGER_LOG)0x0) {
                            httpHandleData._4_4_ = HTTPAPI_ALLOC_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            l_29 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_ALLOC_FAILED);
                              uVar10 = 0;
                              uVar8 = CONCAT44(uVar11,0xf);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x2d8,1,"(result = %s%s (%d))","",
                                        pcVar4,uVar8);
                              uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                              uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                            }
                            free(l_27);
                            break;
                          }
                          free(l_27);
                          i = (size_t)l_28;
                          tempBuffer = tempBuffer + 1;
                        }
                        if (httpHandleData._4_4_ == HTTPAPI_OK) {
                          iVar2 = curl_easy_setopt(handle->curl,0x2727,i);
                          if (iVar2 == 0) {
                            if ((content == (uchar *)0x0) || (contentLength == 0)) {
                              if ((requestType != HTTPAPI_REQUEST_GET) &&
                                 ((iVar2 = curl_easy_setopt(handle->curl,0x271f,0), iVar2 != 0 ||
                                  (iVar2 = curl_easy_setopt(handle->curl,0x3c,0), iVar2 != 0)))) {
                                httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                                p_Var3 = xlogging_get_log_function();
                                l_32 = p_Var3;
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                  uVar10 = 0;
                                  uVar8 = CONCAT44(uVar11,5);
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                            ,"HTTPAPI_ExecuteRequest",0x300,1,"(result = %s%s (%d))"
                                            ,"",pcVar4,uVar8);
                                  uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                                  uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                                }
                              }
                            }
                            else {
                              iVar2 = curl_easy_setopt(handle->curl,0x271f,content);
                              if ((iVar2 != 0) ||
                                 (iVar2 = curl_easy_setopt(handle->curl,0x3c,contentLength),
                                 iVar2 != 0)) {
                                httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                                p_Var3 = xlogging_get_log_function();
                                l_31 = p_Var3;
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                  uVar10 = 0;
                                  uVar8 = CONCAT44(uVar11,5);
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                            ,"HTTPAPI_ExecuteRequest",0x2f5,1,"(result = %s%s (%d))"
                                            ,"",pcVar4,uVar8);
                                  uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                                  uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                                }
                              }
                            }
                            if (httpHandleData._4_4_ == HTTPAPI_OK) {
                              iVar2 = curl_easy_setopt(handle->curl,0x272d,0);
                              if (((iVar2 == 0) &&
                                  (iVar2 = curl_easy_setopt(handle->curl,0x4e6f,0), iVar2 == 0)) &&
                                 (iVar2 = curl_easy_setopt(handle->curl,0x4e2b,ContentWriteFunction)
                                 , iVar2 == 0)) {
                                if ((responseHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) &&
                                   ((iVar2 = curl_easy_setopt(handle->curl,0x272d,
                                                              responseHeadersHandle), iVar2 != 0 ||
                                    (iVar2 = curl_easy_setopt(handle->curl,0x4e6f,
                                                              HeadersWriteFunction), iVar2 != 0))))
                                {
                                  httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                                  p_Var3 = xlogging_get_log_function();
                                  l_34 = p_Var3;
                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                    pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                    uVar10 = 0;
                                    uVar8 = CONCAT44(uVar11,5);
                                    (*p_Var3)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                              ,"HTTPAPI_ExecuteRequest",0x31b,1,
                                              "(result = %s%s (%d))","",pcVar4,uVar8);
                                    uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                                    uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                                  }
                                }
                                if (httpHandleData._4_4_ == HTTPAPI_OK) {
                                  l = (LOGGER_LOG)0x0;
                                  responseContentBuffer.buffer = (uchar *)0x0;
                                  responseContentBuffer.bufferSize._0_1_ = '\0';
                                  iVar2 = curl_easy_setopt(handle->curl,0x2711,&l);
                                  if (iVar2 != 0) {
                                    httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                                    p_Var3 = xlogging_get_log_function();
                                    p_Stack_1b8 = p_Var3;
                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                      pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                      uVar10 = 0;
                                      uVar8 = CONCAT44(uVar11,5);
                                      (*p_Var3)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                ,"HTTPAPI_ExecuteRequest",0x328,1,
                                                "(result = %s%s (%d))","",pcVar4,uVar8);
                                      uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                                      uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
                                    }
                                  }
                                  if (httpHandleData._4_4_ == HTTPAPI_OK) {
                                    l_35._4_4_ = curl_easy_perform(handle->curl);
                                    if (l_35._4_4_ == 0) {
                                      iVar2 = curl_easy_getinfo(handle->curl,0x200002,&l_37);
                                      if (iVar2 == 0) {
                                        if ((char)responseContentBuffer.bufferSize == '\0') {
                                          if (statusCode != (uint *)0x0) {
                                            *statusCode = (uint)l_37;
                                          }
                                          if (((responseContent != (BUFFER_HANDLE)0x0) &&
                                              (responseContentBuffer.buffer != (uchar *)0x0)) &&
                                             (iVar2 = BUFFER_build(responseContent,(uchar *)l,
                                                                   (size_t)responseContentBuffer.
                                                                           buffer), iVar2 != 0)) {
                                            httpHandleData._4_4_ =
                                                 HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                                            p_Var3 = xlogging_get_log_function();
                                            if (p_Var3 != (LOGGER_LOG)0x0) {
                                              pcVar4 = HTTPAPI_RESULTStrings
                                                                 (
                                                  HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER);
                                              uVar10 = 0;
                                              (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x351,1,
                                                  "(result = %s%s (%d))","",pcVar4,
                                                  CONCAT44(uVar11,0x11));
                                              uVar9 = (undefined4)((ulong)pcVar4 >> 0x20);
                                            }
                                          }
                                          if ((long)l_37 < 300) {
                                            httpHandleData._4_4_ = HTTPAPI_OK;
                                          }
                                          else {
                                            p_Var3 = xlogging_get_log_function();
                                            if (p_Var3 != (LOGGER_LOG)0x0) {
                                              (*p_Var3)(AZ_LOG_ERROR,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x35b,1,
                                                  "Failure in HTTP communication: server reply code is %ld"
                                                  ,l_37);
                                              uVar10 = (undefined4)((ulong)l_37 >> 0x20);
                                            }
                                            p_Var3 = xlogging_get_log_function();
                                            if (p_Var3 != (LOGGER_LOG)0x0) {
                                              (*p_Var3)(AZ_LOG_INFO,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x35d,1,
                                                  "HTTP Response:%*.*s",
                                                  CONCAT44(uVar10,(int)responseContentBuffer.buffer)
                                                  ,CONCAT44(uVar9,(int)responseContentBuffer.buffer)
                                                  ,l);
                                            }
                                          }
                                        }
                                        else {
                                          httpHandleData._4_4_ = HTTPAPI_READ_DATA_FAILED;
                                          p_Var3 = xlogging_get_log_function();
                                          if (p_Var3 != (LOGGER_LOG)0x0) {
                                            pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_READ_DATA_FAILED)
                                            ;
                                            (*p_Var3)(AZ_LOG_ERROR,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x342,1,
                                                  "(result = %s%s (%d))","",pcVar4,
                                                  CONCAT44(uVar11,10));
                                          }
                                        }
                                      }
                                      else {
                                        httpHandleData._4_4_ = HTTPAPI_QUERY_HEADERS_FAILED;
                                        p_Var3 = xlogging_get_log_function();
                                        if (p_Var3 != (LOGGER_LOG)0x0) {
                                          pcVar4 = HTTPAPI_RESULTStrings
                                                             (HTTPAPI_QUERY_HEADERS_FAILED);
                                          (*p_Var3)(AZ_LOG_ERROR,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x33d,1,
                                                  "(result = %s%s (%d))","",pcVar4,
                                                  CONCAT44(uVar11,8));
                                        }
                                      }
                                    }
                                    else {
                                      p_Var3 = xlogging_get_log_function();
                                      l_36 = p_Var3;
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        uVar8 = curl_easy_strerror();
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x331,1,
                                                  "curl_easy_perform() failed: %s\n",uVar8);
                                      }
                                      httpHandleData._4_4_ = HTTPAPI_OPEN_REQUEST_FAILED;
                                      p_Var3 = xlogging_get_log_function();
                                      httpCode = (long)p_Var3;
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_OPEN_REQUEST_FAILED);
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_ExecuteRequest",0x333,1,
                                                  "(result = %s%s (%d))","",pcVar4,
                                                  CONCAT44(uVar11,4));
                                      }
                                    }
                                  }
                                  if (l != (LOGGER_LOG)0x0) {
                                    free(l);
                                    l = (LOGGER_LOG)0x0;
                                  }
                                }
                              }
                              else {
                                httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                                p_Var3 = xlogging_get_log_function();
                                l_33 = p_Var3;
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                            ,"HTTPAPI_ExecuteRequest",0x310,1,"(result = %s%s (%d))"
                                            ,"",pcVar4,CONCAT44(uVar11,5));
                                }
                              }
                            }
                          }
                          else {
                            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                            p_Var3 = xlogging_get_log_function();
                            l_30 = p_Var3;
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_ExecuteRequest",0x2e9,1,"(result = %s%s (%d))","",
                                        pcVar4,CONCAT44(uVar11,5));
                            }
                          }
                        }
                        curl_slist_free_all(i);
                      }
                    }
                    else {
                      httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                      p_Var3 = xlogging_get_log_function();
                      l_13 = p_Var3;
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_ExecuteRequest",0x24e,1,
                                  "failed to set CURLOPT_HTTP_VERSION (result = %s%s (%d))","",
                                  pcVar4,CONCAT44(uVar10,5));
                      }
                    }
                  }
                  else {
                    httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                    p_Var3 = xlogging_get_log_function();
                    l_12 = p_Var3;
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                ,"HTTPAPI_ExecuteRequest",0x249,1,
                                "failed to set CURLOPT_FORBID_REUSE (result = %s%s (%d))","",pcVar4,
                                CONCAT44(uVar10,5));
                    }
                  }
                }
                else {
                  httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                  p_Var3 = xlogging_get_log_function();
                  l_11 = p_Var3;
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                              ,"HTTPAPI_ExecuteRequest",0x244,1,
                              "failed to set CURLOPT_FRESH_CONNECT (result = %s%s (%d))","",pcVar4,
                              CONCAT44(uVar10,5));
                  }
                }
              }
              else {
                httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
                p_Var3 = xlogging_get_log_function();
                l_10 = p_Var3;
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                            ,"HTTPAPI_ExecuteRequest",0x23f,1,
                            "failed to set CURLOPT_LOW_SPEED_TIME (result = %s%s (%d))","",pcVar4,
                            CONCAT44(uVar10,5));
                }
              }
            }
            else {
              httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
              p_Var3 = xlogging_get_log_function();
              l_9 = p_Var3;
              if (p_Var3 != (LOGGER_LOG)0x0) {
                pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                          ,"HTTPAPI_ExecuteRequest",0x23a,1,
                          "failed to set CURLOPT_LOW_SPEED_LIMIT (result = %s%s (%d))","",pcVar4,
                          CONCAT44(uVar10,5));
              }
            }
          }
          else {
            httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
            p_Var3 = xlogging_get_log_function();
            l_8 = p_Var3;
            if (p_Var3 != (LOGGER_LOG)0x0) {
              pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                        ,"HTTPAPI_ExecuteRequest",0x235,1,
                        "failed to set CURLOPT_TIMEOUT_MS (result = %s%s (%d))","",pcVar4,
                        CONCAT44(uVar10,5));
            }
          }
        }
        else {
          httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
          p_Var3 = xlogging_get_log_function();
          l_7 = p_Var3;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                      ,"HTTPAPI_ExecuteRequest",0x230,1,
                      "failed to set CURLOPT_URL (result = %s%s (%d))","",pcVar4,CONCAT44(uVar10,5))
            ;
          }
        }
        goto LAB_001096e5;
      }
    }
    httpHandleData._4_4_ = HTTPAPI_STRING_PROCESSING_ERROR;
    p_Var3 = xlogging_get_log_function();
    l_6 = p_Var3;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_STRING_PROCESSING_ERROR);
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_ExecuteRequest",0x22a,1,"(result = %s%s (%d))","",pcVar4,
                CONCAT44(uVar10,0xe));
    }
  }
  else {
    httpHandleData._4_4_ = HTTPAPI_SET_OPTION_FAILED;
    p_Var3 = xlogging_get_log_function();
    l_5 = p_Var3;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar4 = HTTPAPI_RESULTStrings(HTTPAPI_SET_OPTION_FAILED);
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_ExecuteRequest",0x224,1,
                "failed to set CURLOPT_VERBOSE (result = %s%s (%d))","",pcVar4,CONCAT44(uVar10,5));
    }
  }
LAB_001096e5:
  free((void *)tempHostURL_size);
  return httpHandleData._4_4_;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_ExecuteRequest(HTTP_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
                                      HTTP_HEADERS_HANDLE httpHeadersHandle, const unsigned char* content,
                                      size_t contentLength, unsigned int* statusCode,
                                      HTTP_HEADERS_HANDLE responseHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPI_RESULT result;
    HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
    size_t headersCount;
    HTTP_RESPONSE_CONTENT_BUFFER responseContentBuffer;

    if ((httpHandleData == NULL) ||
        (relativePath == NULL) ||
        (httpHeadersHandle == NULL) ||
        ((content == NULL) && (contentLength > 0))
    )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else if (HTTPHeaders_GetHeaderCount(httpHeadersHandle, &headersCount) != HTTP_HEADERS_OK)
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
    }
    else
    {
        char* tempHostURL;
        size_t tempHostURL_size = safe_add_size_t(strlen(httpHandleData->hostURL), strlen(relativePath));
        tempHostURL_size = safe_add_size_t(tempHostURL_size, 1);
        if (tempHostURL_size == SIZE_MAX)
        {
            LogError("Invalid malloc size");
            tempHostURL = NULL;
        }
        else
        {
            tempHostURL = malloc(tempHostURL_size);
        }

        if (tempHostURL == NULL)
        {
            result = HTTPAPI_ERROR;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
        }
        else
        {
            if (curl_easy_setopt(httpHandleData->curl, CURLOPT_VERBOSE, httpHandleData->verbose) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_VERBOSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if ((strcpy_s(tempHostURL, tempHostURL_size, httpHandleData->hostURL) != 0) ||
                (strcat_s(tempHostURL, tempHostURL_size, relativePath) != 0))
            {
                result = HTTPAPI_STRING_PROCESSING_ERROR;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            /* set the URL */
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_URL, tempHostURL) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_URL (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_TIMEOUT_MS, httpHandleData->timeout) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_TIMEOUT_MS (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_LIMIT, httpHandleData->lowSpeedLimit) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_LIMIT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_LOW_SPEED_TIME, httpHandleData->lowSpeedTime) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_LOW_SPEED_TIME (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FRESH_CONNECT, httpHandleData->freshConnect) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FRESH_CONNECT (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_FORBID_REUSE, httpHandleData->forbidReuse) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_FORBID_REUSE (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_1) != CURLE_OK)
            {
                result = HTTPAPI_SET_OPTION_FAILED;
                LogError("failed to set CURLOPT_HTTP_VERSION (result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
            }
            else
            {
                result = HTTPAPI_OK;

                switch (requestType)
                {
                default:
                    result = HTTPAPI_INVALID_ARG;
                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    break;

                case HTTPAPI_REQUEST_GET:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_HEAD:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPGET, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_NOBODY, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }

                    break;

                case HTTPAPI_REQUEST_POST:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, NULL) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;

                case HTTPAPI_REQUEST_PUT:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L))
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PUT") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_DELETE:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "DELETE") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }
                    break;

                case HTTPAPI_REQUEST_PATCH:
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_POST, 1L) != CURLE_OK)
                    {
                        result = HTTPAPI_SET_OPTION_FAILED;
                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                    }
                    else
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_CUSTOMREQUEST, "PATCH") != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                    }

                    break;
                }

                if (result == HTTPAPI_OK)
                {
                    /* add headers */
                    struct curl_slist* headers = NULL;
                    size_t i;

                    for (i = 0; i < headersCount; i++)
                    {
                        char *tempBuffer;
                        if (HTTPHeaders_GetHeader(httpHeadersHandle, i, &tempBuffer) != HTTP_HEADERS_OK)
                        {
                            /* error */
                            result = HTTPAPI_HTTP_HEADERS_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                            break;
                        }
                        else
                        {
                            struct curl_slist* newHeaders = curl_slist_append(headers, tempBuffer);
                            if (newHeaders == NULL)
                            {
                                result = HTTPAPI_ALLOC_FAILED;
                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                free(tempBuffer);
                                break;
                            }
                            else
                            {
                                free(tempBuffer);
                                headers = newHeaders;
                            }
                        }
                    }

                    if (result == HTTPAPI_OK)
                    {
                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_HTTPHEADER, headers) != CURLE_OK)
                        {
                            result = HTTPAPI_SET_OPTION_FAILED;
                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                        }
                        else
                        {
                            /* add content */
                            if ((content != NULL) &&
                                (contentLength > 0))
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)content) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, contentLength) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                            }
                            else
                            {
                                if (requestType != HTTPAPI_REQUEST_GET)
                                {
                                    if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDS, (void*)NULL) != CURLE_OK) ||
                                        (curl_easy_setopt(httpHandleData->curl, CURLOPT_POSTFIELDSIZE, 0) != CURLE_OK))
                                    {
                                        result = HTTPAPI_SET_OPTION_FAILED;
                                        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                    }
                                }
                                else
                                {
                                    /*GET request cannot POST, so "do nothing*/
                                }
                            }

                            if (result == HTTPAPI_OK)
                            {
                                if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, NULL) != CURLE_OK) ||
                                    (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEFUNCTION, ContentWriteFunction) != CURLE_OK))
                                {
                                    result = HTTPAPI_SET_OPTION_FAILED;
                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                }
                                else
                                {
                                    if (responseHeadersHandle != NULL)
                                    {
                                        /* setup the code to get the response headers */
                                        if ((curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEHEADER, responseHeadersHandle) != CURLE_OK) ||
                                            (curl_easy_setopt(httpHandleData->curl, CURLOPT_HEADERFUNCTION, HeadersWriteFunction) != CURLE_OK))
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }
                                    }

                                    if (result == HTTPAPI_OK)
                                    {
                                        responseContentBuffer.buffer = NULL;
                                        responseContentBuffer.bufferSize = 0;
                                        responseContentBuffer.error = 0;

                                        if (curl_easy_setopt(httpHandleData->curl, CURLOPT_WRITEDATA, &responseContentBuffer) != CURLE_OK)
                                        {
                                            result = HTTPAPI_SET_OPTION_FAILED;
                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                        }

                                        if (result == HTTPAPI_OK)
                                        {
                                            /* Execute request */
                                            CURLcode curlRes = curl_easy_perform(httpHandleData->curl);
                                            if (curlRes != CURLE_OK)
                                            {
                                                LogError("curl_easy_perform() failed: %s\n", curl_easy_strerror(curlRes));
                                                result = HTTPAPI_OPEN_REQUEST_FAILED;
                                                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                            }
                                            else
                                            {
                                                long httpCode;

                                                /* get the status code */
                                                if (curl_easy_getinfo(httpHandleData->curl, CURLINFO_RESPONSE_CODE, &httpCode) != CURLE_OK)
                                                {
                                                    result = HTTPAPI_QUERY_HEADERS_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else if (responseContentBuffer.error)
                                                {
                                                    result = HTTPAPI_READ_DATA_FAILED;
                                                    LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                }
                                                else
                                                {
                                                    if (statusCode != NULL)
                                                    {
                                                        *statusCode = (unsigned int)httpCode;
                                                    }

                                                    /* fill response content length */
                                                    if (responseContent != NULL)
                                                    {
                                                        if ((responseContentBuffer.bufferSize > 0) && (BUFFER_build(responseContent, responseContentBuffer.buffer, responseContentBuffer.bufferSize) != 0))
                                                        {
                                                            result = HTTPAPI_INSUFFICIENT_RESPONSE_BUFFER;
                                                            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
                                                        }
                                                        else
                                                        {
                                                            /*all nice*/
                                                        }
                                                    }

                                                    if (httpCode >= 300)
                                                    {
                                                        LogError("Failure in HTTP communication: server reply code is %ld", httpCode);
                                                        LogInfo("HTTP Response:%*.*s", (int)responseContentBuffer.bufferSize,
                                                            (int)responseContentBuffer.bufferSize, responseContentBuffer.buffer);
                                                    }
                                                    else
                                                    {
                                                        result = HTTPAPI_OK;
                                                    }
                                                }
                                            }
                                        }

                                        if (responseContentBuffer.buffer != NULL)
                                        {
                                            free(responseContentBuffer.buffer);
                                            responseContentBuffer.buffer = NULL;
                                        }
                                    }
                                }
                            }
                        }
                    }
                    curl_slist_free_all(headers);
                }
            }
            free(tempHostURL);
        }
    }

    return result;
}